

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O3

int rmw_mip(CPURISCVState_conflict2 *env,int csrno,target_ulong *ret_value,target_ulong new_value,
           target_ulong write_mask)

{
  uint uVar1;
  
  uVar1 = ~env->miclaim & (uint)write_mask & 0x666;
  if (uVar1 == 0) {
    uVar1 = (uint)env->mip;
  }
  else {
    uVar1 = riscv_cpu_update_mip_riscv64
                      ((RISCVCPU_conflict *)&env[-0x18].pmp_state.num_rules,uVar1,
                       (uint)new_value & uVar1);
  }
  if (ret_value != (target_ulong *)0x0) {
    *ret_value = (ulong)uVar1;
  }
  return 0;
}

Assistant:

static int rmw_mip(CPURISCVState *env, int csrno, target_ulong *ret_value,
                   target_ulong new_value, target_ulong write_mask)
{
    RISCVCPU *cpu = env_archcpu(env);
    /* Allow software control of delegable interrupts not claimed by hardware */
    target_ulong mask = write_mask & delegable_ints & ~env->miclaim;
    uint32_t old_mip;

    if (mask) {
        old_mip = riscv_cpu_update_mip(cpu, mask, (new_value & mask));
    } else {
        old_mip = env->mip;
    }

    if (ret_value) {
        *ret_value = old_mip;
    }

    return 0;
}